

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::configure_context::test_method(configure_context *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *prev;
  service *psVar4;
  undefined4 extraout_var;
  unique_id local_178;
  undefined8 local_170;
  basic_cstring<const_char> local_168;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_158;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  undefined1 local_110 [8];
  injected<Inject::service> actual;
  context<0> c;
  simple_config s;
  provides<Inject::service> xxx;
  string local_78;
  component<Inject::impl1> local_58;
  component<Inject::impl1> xx;
  allocator<char> local_39;
  string local_38;
  component<Inject::service> local_18;
  component<Inject::service> x;
  configure_context *this_local;
  
  x._vptr_component = (_func_int **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"s",&local_39);
  inject::context<0>::component<Inject::service>::component(&local_18,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"impl1",(allocator<char> *)((long)&xxx._vptr_provides + 7));
  inject::context<0>::component<Inject::impl1>::component(&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&xxx._vptr_provides + 7));
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides
            ((provides<Inject::service> *)&s);
  test_method::simple_config::simple_config((simple_config *)&c._parent);
  inject::context<0>::context((context<0> *)&actual._ptr.pn,(context_config *)&c._parent);
  inject::context<0>::injected<Inject::service>::injected((injected<Inject::service> *)local_110);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_130);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_120,0x11b,&local_130);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_158,prev,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar4 = inject::context<0>::injected<Inject::service>::operator->
                       ((injected<Inject::service> *)local_110);
    iVar3 = (**psVar4->_vptr_service)();
    local_170 = CONCAT44(extraout_var,iVar3);
    local_178 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_158,&local_168,0x11b,1,2,&local_170,"actual->id()",&local_178,
               "id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  inject::context<0>::injected<Inject::service>::~injected((injected<Inject::service> *)local_110);
  inject::context<0>::~context((context<0> *)&actual._ptr.pn);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::~provides
            ((provides<Inject::service> *)&s);
  inject::context<0>::component<Inject::impl1>::~component(&local_58);
  inject::context<0>::component<Inject::service>::~component(&local_18);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(configure_context)
{
    context<>::component<service> x("s");
    context<>::component<impl1> xx("impl1");
    context<>::component<impl1>::provides<service> xxx;

    class simple_config : public context_config {
    public:
        context_bindings bindings() {
            context_config::context_bindings result;
            result.push_back(config_bind("s", "impl1", scope_none));
            return result;
        }
    };

    simple_config s;
    context<> c(s);

    context<>::injected<service> actual;
    BOOST_CHECK_EQUAL(actual->id(), id_of<impl1>::id());
}